

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

ostream * glu::decl::operator<<(ostream *str,DeclareStructTypePtr *decl)

{
  bool bVar1;
  ostream *poVar2;
  pointer pSVar3;
  VarType *varType;
  char *pcVar4;
  Indent local_bc;
  StructMember *local_b8;
  allocator<char> local_99;
  string local_98;
  DeclareVariable local_78;
  Indent local_34;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_30;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_28;
  ConstIterator memberIter;
  DeclareStructTypePtr *decl_local;
  ostream *str_local;
  
  std::operator<<(str,"struct");
  bVar1 = StructType::hasTypeName(decl->structPtr);
  if (bVar1) {
    poVar2 = std::operator<<(str," ");
    pcVar4 = StructType::getTypeName(decl->structPtr);
    std::operator<<(poVar2,pcVar4);
  }
  poVar2 = std::operator<<(str,"\n");
  memberIter._M_current._4_4_ = indent(decl->indentLevel);
  poVar2 = operator<<(poVar2,(Indent *)((long)&memberIter._M_current + 4));
  std::operator<<(poVar2,"{\n");
  local_28._M_current = (StructMember *)StructType::begin(decl->structPtr);
  while( true ) {
    local_30._M_current = (StructMember *)StructType::end(decl->structPtr);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_34 = indent(decl->indentLevel + 1);
    operator<<(str,&local_34);
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
             ::operator->(&local_28);
    varType = StructMember::getType(pSVar3);
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
             ::operator->(&local_28);
    pcVar4 = StructMember::getName(pSVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar4,&local_99);
    declare(&local_78,varType,&local_98,decl->indentLevel + 1);
    poVar2 = operator<<(str,&local_78);
    std::operator<<(poVar2,";\n");
    DeclareVariable::~DeclareVariable(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    local_b8 = (StructMember *)
               __gnu_cxx::
               __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
               ::operator++(&local_28,0);
  }
  local_bc = indent(decl->indentLevel);
  poVar2 = operator<<(str,&local_bc);
  std::operator<<(poVar2,"}");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DeclareStructTypePtr& decl)
{
	str << "struct";

	// Type name is optional.
	if (decl.structPtr->hasTypeName())
		str << " " << decl.structPtr->getTypeName();

	str << "\n" << indent(decl.indentLevel) << "{\n";

	for (StructType::ConstIterator memberIter = decl.structPtr->begin(); memberIter != decl.structPtr->end(); memberIter++)
	{
		str << indent(decl.indentLevel+1);
		str << declare(memberIter->getType(), memberIter->getName(), decl.indentLevel+1) << ";\n";
	}

	str << indent(decl.indentLevel) << "}";

	return str;
}